

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  int64_t iVar5;
  void *pvVar6;
  long lVar7;
  int64_t iVar8;
  void *pvVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  wchar_t wVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  size_t min;
  
  wVar12 = L'\xffffffff';
  if (best_bid < L'!') {
    pvVar3 = a->format->data;
    sVar4 = __archive_read_seek(a,0,2);
    wVar12 = L'\0';
    if (0 < (long)sVar4) {
      min = 0x4000;
      if ((long)sVar4 < 0x4000) {
        min = sVar4;
      }
      iVar14 = (int)min;
      iVar5 = __archive_read_seek(a,(long)-iVar14,2);
      if (-1 < iVar5) {
        pvVar6 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        wVar12 = L'\0';
        if ((pvVar6 != (void *)0x0) && (wVar12 = L'\0', 0x15 < iVar14)) {
          iVar15 = 0;
          do {
            lVar7 = (long)iVar15;
            bVar1 = *(byte *)((long)pvVar6 + lVar7 + 3);
            if (bVar1 < 7) {
              if (bVar1 != 5) {
                if (bVar1 != 6) goto LAB_00134d80;
                if (*(int *)((long)pvVar6 + lVar7) == 0x6054b50) {
                  bVar13 = true;
                  wVar12 = L'\0';
                  if ((((*(short *)((long)pvVar6 + lVar7 + 4) == 0) &&
                       (wVar12 = L'\0', *(short *)((long)pvVar6 + lVar7 + 6) == 0)) &&
                      (wVar12 = L'\0',
                      *(short *)((long)pvVar6 + lVar7 + 10) == *(short *)((long)pvVar6 + lVar7 + 8))
                      ) && (uVar2 = *(uint *)((long)pvVar6 + lVar7 + 0x10),
                           (long)(ulong)(*(int *)((long)pvVar6 + lVar7 + 0xc) + uVar2) <=
                           iVar5 + lVar7)) {
                    *(ulong *)((long)pvVar3 + 0x40) = (ulong)uVar2;
                    wVar12 = L' ';
                    bVar13 = false;
                  }
                  if (!bVar13) {
                    return wVar12;
                  }
                }
              }
              iVar15 = iVar15 + 1;
            }
            else if (bVar1 == 7) {
              if (*(int *)((long)pvVar6 + lVar7) == 0x7064b50) {
                bVar13 = true;
                wVar12 = L'\0';
                if ((*(int *)((long)pvVar6 + lVar7 + 4) == 0) &&
                   (*(int *)((long)pvVar6 + lVar7 + 0x10) == 1)) {
                  iVar8 = __archive_read_seek(a,*(int64_t *)((long)pvVar6 + lVar7 + 8),0);
                  if ((-1 < iVar8) &&
                     ((pvVar9 = __archive_read_ahead(a,0x38,(ssize_t *)0x0), pvVar9 != (void *)0x0
                      && (0xffffffffffffc036 < *(long *)((long)pvVar9 + 4) - 0x3ff5U)))) {
                    pvVar9 = __archive_read_ahead
                                       (a,*(long *)((long)pvVar9 + 4) + 0xc,(ssize_t *)0x0);
                    if (pvVar9 != (void *)0x0) {
                      bVar13 = true;
                      wVar12 = L'\0';
                      if ((*(int *)((long)pvVar9 + 0x10) == 0) &&
                         (wVar12 = L'\0', *(int *)((long)pvVar9 + 0x14) == 0)) {
                        uVar10 = archive_le64dec((void *)((long)pvVar9 + 0x18));
                        uVar11 = archive_le64dec((void *)((long)pvVar9 + 0x20));
                        bVar13 = true;
                        if (uVar10 == uVar11) {
                          uVar10 = archive_le64dec((void *)((long)pvVar9 + 0x30));
                          *(uint64_t *)((long)pvVar3 + 0x40) = uVar10;
                          wVar12 = L' ';
                          bVar13 = false;
                        }
                      }
                      goto LAB_00134d75;
                    }
                  }
                  wVar12 = L'\0';
                  bVar13 = true;
                }
LAB_00134d75:
                if (!bVar13) {
                  return wVar12;
                }
              }
LAB_00134d80:
              iVar15 = iVar15 + 4;
            }
            else if (bVar1 == 0x50) {
              iVar15 = iVar15 + 3;
            }
            else {
              if (bVar1 != 0x4b) goto LAB_00134d80;
              iVar15 = iVar15 + 2;
            }
          } while (iVar15 <= iVar14 + -0x16);
          wVar12 = L'\0';
        }
      }
    }
  }
  return wVar12;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) or Zip64 locator
	 * record (which begins with PK\006\007) */
	tail = zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* TODO: Rework this to search backwards from the end.  We
	 * normally expect the EOCD record to be at the very end, so
	 * that should be significantly faster.  Tricky part: Make
	 * sure we still prefer the Zip64 locator if it's present. */
	for (i = 0; i <= tail - 22;) {
		switch (p[i + 3]) {
		case 'P': i += 3; break;
		case 'K': i += 2; break;
		case 005: i += 1; break;
		case 006:
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i, current_offset + i);
				if (ret > 0)
					return (ret);
			}
			i += 1; /* Look for PK\006\007 next */
			break;
		case 007:
			if (memcmp(p + i, "PK\006\007", 4) == 0) {
				int ret = read_zip64_eocd(a, zip, p + i);
				if (ret > 0)
					return (ret);
			}
			i += 4;
			break;
		default: i += 4; break;
		}
	}
	return 0;
}